

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

If_Grp_t *
If_CluCheck(If_Grp_t *__return_storage_ptr__,If_Man_t *p,word *pTruth0,int nVars,int iVarStart,
           int iVarStop,int nLutLeaf,int nLutRoot,If_Grp_t *pR,word *pFunc0,word *pFunc1,
           word *pLeftOver,int fHashing)

{
  int iVar1;
  uint uVar2;
  word wVar3;
  word wVar4;
  int local_424c;
  int local_4238 [2];
  int P2V2 [18];
  int local_41e8 [2];
  int V2P2 [18];
  int local_4198;
  int k;
  int iNewPos;
  undefined1 uStack_418c;
  undefined1 uStack_418b;
  undefined8 local_418a;
  undefined2 local_4182;
  If_Grp_t local_4180;
  If_Grp_t local_416e;
  If_Grp_t local_415c;
  If_Grp_t local_414a;
  int local_4138;
  int nLutSize;
  int uCanonPhase;
  int nSupp;
  int i;
  int pCanonPerm [16];
  int P2V [18];
  int local_4098 [2];
  int V2P [18];
  word local_4048;
  word pF [1024];
  word pTruth [1024];
  word Truth;
  uint *pHashed;
  If_Grp_t R;
  int iVarStop_local;
  int iVarStart_local;
  int nVars_local;
  word *pTruth0_local;
  If_Man_t *p_local;
  
  R.pVars._8_4_ = iVarStop;
  R.pVars._12_4_ = iVarStart;
  memset(__return_storage_ptr__,0,0x12);
  memset((void *)((long)&pHashed + 2),0,0x12);
  Truth = 0;
  local_424c = nVars;
  if (p != (If_Man_t *)0x0) {
    local_424c = p->pPars->nLutSize;
  }
  local_4138 = local_424c;
  if (0x10 < nVars) {
    __assert_fail("nVars <= CLU_VAR_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                  ,0x61b,
                  "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                 );
  }
  if (nLutLeaf + nLutRoot + -1 < nVars) {
    __assert_fail("nVars <= nLutLeaf + nLutRoot - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                  ,0x61c,
                  "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                 );
  }
  if (pR != (If_Grp_t *)0x0) {
    pR->nVars = '\0';
    *pFunc0 = 0;
    *pFunc1 = 0;
  }
  If_CluCopy(pF + 0x3ff,pTruth0,local_424c);
  If_CluCopy(&local_4048,pF + 0x3ff,nVars);
  for (uCanonPhase = 0; uCanonPhase < nVars; uCanonPhase = uCanonPhase + 1) {
    pCanonPerm[(long)uCanonPhase + 0xe] = uCanonPhase;
    local_4098[uCanonPhase] = uCanonPhase;
  }
  nLutSize = If_CluSupport(&local_4048,nVars);
  if ((nLutSize != 0) && (iVar1 = If_CluSuppIsMinBase(nLutSize), iVar1 != 0)) {
    if ((p != (If_Man_t *)0x0) &&
       (((fHashing != 0 &&
         (Truth = (word)If_CluHashLookup(p,pF + 0x3ff,0), (uint *)Truth != (uint *)0x0)) &&
        (*(uint *)Truth != 0xff)))) {
      If_CluUns2Grp(*(uint *)Truth,__return_storage_ptr__);
    }
    if (R.pVars._8_4_ != 0) {
      If_CluMoveVar(&local_4048,nVars,local_4098,pCanonPerm + 0xe,0,nVars + -1);
    }
    if (__return_storage_ptr__->nVars == '\0') {
      s_Count2 = s_Count2 + 1;
      if (R.pVars._12_4_ == 0) {
        If_CluDecUsingCofs(&local_414a,pF + 0x3ff,nVars,nLutLeaf);
        __return_storage_ptr__->nVars = local_414a.nVars;
        __return_storage_ptr__->nMyu = local_414a.nMyu;
        __return_storage_ptr__->pVars[0] = local_414a.pVars[0];
        __return_storage_ptr__->pVars[1] = local_414a.pVars[1];
        __return_storage_ptr__->pVars[2] = local_414a.pVars[2];
        __return_storage_ptr__->pVars[3] = local_414a.pVars[3];
        __return_storage_ptr__->pVars[4] = local_414a.pVars[4];
        __return_storage_ptr__->pVars[5] = local_414a.pVars[5];
        *(undefined8 *)(__return_storage_ptr__->pVars + 6) = local_414a.pVars._6_8_;
        *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = local_414a.pVars._14_2_;
      }
      if (__return_storage_ptr__->nVars == '\0') {
        If_CluFindGroup(&local_415c,&local_4048,nVars,R.pVars._12_4_,R.pVars._8_4_,local_4098,
                        pCanonPerm + 0xe,nLutLeaf,(uint)(nLutLeaf + nLutRoot == nVars + 1));
        __return_storage_ptr__->nVars = local_415c.nVars;
        __return_storage_ptr__->nMyu = local_415c.nMyu;
        __return_storage_ptr__->pVars[0] = local_415c.pVars[0];
        __return_storage_ptr__->pVars[1] = local_415c.pVars[1];
        __return_storage_ptr__->pVars[2] = local_415c.pVars[2];
        __return_storage_ptr__->pVars[3] = local_415c.pVars[3];
        __return_storage_ptr__->pVars[4] = local_415c.pVars[4];
        __return_storage_ptr__->pVars[5] = local_415c.pVars[5];
        *(undefined8 *)(__return_storage_ptr__->pVars + 6) = local_415c.pVars._6_8_;
        *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = local_415c.pVars._14_2_;
        if (__return_storage_ptr__->nVars == '\0') {
          if (nVars < nLutLeaf + nLutRoot + -2) {
            If_CluFindGroup(&local_416e,&local_4048,nVars,R.pVars._12_4_,R.pVars._8_4_,local_4098,
                            pCanonPerm + 0xe,nLutLeaf + -1,
                            (uint)(nLutLeaf + -1 + nLutRoot == nVars + 1));
            __return_storage_ptr__->nVars = local_416e.nVars;
            __return_storage_ptr__->nMyu = local_416e.nMyu;
            __return_storage_ptr__->pVars[0] = local_416e.pVars[0];
            __return_storage_ptr__->pVars[1] = local_416e.pVars[1];
            __return_storage_ptr__->pVars[2] = local_416e.pVars[2];
            __return_storage_ptr__->pVars[3] = local_416e.pVars[3];
            __return_storage_ptr__->pVars[4] = local_416e.pVars[4];
            __return_storage_ptr__->pVars[5] = local_416e.pVars[5];
            *(undefined8 *)(__return_storage_ptr__->pVars + 6) = local_416e.pVars._6_8_;
            *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = local_416e.pVars._14_2_;
          }
          if ((4 < nLutLeaf) && (nVars < nLutLeaf + nLutRoot + -3)) {
            If_CluFindGroup(&local_4180,&local_4048,nVars,R.pVars._12_4_,R.pVars._8_4_,local_4098,
                            pCanonPerm + 0xe,nLutLeaf + -2,
                            (uint)(nLutLeaf + -2 + nLutRoot == nVars + 1));
            __return_storage_ptr__->nVars = local_4180.nVars;
            __return_storage_ptr__->nMyu = local_4180.nMyu;
            __return_storage_ptr__->pVars[0] = local_4180.pVars[0];
            __return_storage_ptr__->pVars[1] = local_4180.pVars[1];
            __return_storage_ptr__->pVars[2] = local_4180.pVars[2];
            __return_storage_ptr__->pVars[3] = local_4180.pVars[3];
            __return_storage_ptr__->pVars[4] = local_4180.pVars[4];
            __return_storage_ptr__->pVars[5] = local_4180.pVars[5];
            *(undefined8 *)(__return_storage_ptr__->pVars + 6) = local_4180.pVars._6_8_;
            *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = local_4180.pVars._14_2_;
          }
          if (__return_storage_ptr__->nVars == '\0') {
            If_CluReverseOrder(&local_4048,nVars,local_4098,pCanonPerm + 0xe,R.pVars._12_4_);
            If_CluFindGroup((If_Grp_t *)((long)&k + 2),&local_4048,nVars,R.pVars._12_4_,
                            R.pVars._8_4_,local_4098,pCanonPerm + 0xe,nLutLeaf,
                            (uint)(nLutLeaf + nLutRoot == nVars + 1));
            __return_storage_ptr__->nVars = k._2_1_;
            __return_storage_ptr__->nMyu = k._3_1_;
            __return_storage_ptr__->pVars[0] = (undefined1)iNewPos;
            __return_storage_ptr__->pVars[1] = iNewPos._1_1_;
            __return_storage_ptr__->pVars[2] = iNewPos._2_1_;
            __return_storage_ptr__->pVars[3] = iNewPos._3_1_;
            __return_storage_ptr__->pVars[4] = uStack_418c;
            __return_storage_ptr__->pVars[5] = uStack_418b;
            *(undefined8 *)(__return_storage_ptr__->pVars + 6) = local_418a;
            *(undefined2 *)(__return_storage_ptr__->pVars + 0xe) = local_4182;
            if (__return_storage_ptr__->nVars == '\0') {
              if (Truth == 0) {
                return __return_storage_ptr__;
              }
              uVar2 = If_CluGrp2Uns(__return_storage_ptr__);
              *(uint *)Truth = uVar2;
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
    if (pR != (If_Grp_t *)0x0) {
      If_CluMoveGroupToMsb(&local_4048,nVars,local_4098,pCanonPerm + 0xe,__return_storage_ptr__);
      if (__return_storage_ptr__->nMyu == '\x02') {
        pTruth[0x3ff] =
             If_CluDeriveDisjoint
                       (&local_4048,nVars,local_4098,pCanonPerm + 0xe,__return_storage_ptr__,
                        (If_Grp_t *)((long)&pHashed + 2));
        local_4198 = pHashed._2_1_ + -1;
      }
      else {
        pTruth[0x3ff] =
             If_CluDeriveNonDisjoint
                       (&local_4048,nVars,local_4098,pCanonPerm + 0xe,__return_storage_ptr__,
                        (If_Grp_t *)((long)&pHashed + 2));
        local_4198 = pHashed._2_1_ + -2;
      }
      if (*(char *)((long)&pHashed + (long)local_4198 + 4) != nVars) {
        __assert_fail("R.pVars[iNewPos] == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                      ,0x6a5,
                      "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                     );
      }
      wVar3 = If_CluAdjust(pTruth[0x3ff],(int)__return_storage_ptr__->nVars);
      if (pHashed._2_1_ < '\x06') {
        local_4048 = If_CluAdjust(local_4048,(int)pHashed._2_1_);
      }
      if (local_4198 < (int)R.pVars._12_4_) {
        __assert_fail("iNewPos >= iVarStart",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                      ,0x6b3,
                      "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                     );
      }
      for (V2P2[0x11] = 0; iVar1 = V2P2[0x11], V2P2[0x11] < pHashed._2_1_;
          V2P2[0x11] = V2P2[0x11] + 1) {
        local_4238[V2P2[0x11]] = V2P2[0x11];
        local_41e8[V2P2[0x11]] = iVar1;
      }
      If_CluMoveVar(&local_4048,(int)pHashed._2_1_,local_41e8,local_4238,local_4198,R.pVars._12_4_);
      for (V2P2[0x11] = local_4198; (int)R.pVars._12_4_ < V2P2[0x11]; V2P2[0x11] = V2P2[0x11] + -1)
      {
        *(undefined1 *)((long)&pHashed + (long)V2P2[0x11] + 4) =
             *(undefined1 *)((long)&pHashed + (long)(V2P2[0x11] + -1) + 4);
      }
      *(char *)((long)&pHashed + (long)(int)R.pVars._12_4_ + 4) = (char)nVars;
      if (pLeftOver != (word *)0x0) {
        if (pHashed._2_1_ < '\x06') {
          wVar4 = If_CluAdjust(local_4048,(int)pHashed._2_1_);
          *pLeftOver = wVar4;
        }
        else {
          If_CluCopy(pLeftOver,&local_4048,(int)pHashed._2_1_);
        }
        If_CluAdjustBig(pLeftOver,(int)pHashed._2_1_,local_4138);
      }
      pR->nVars = pHashed._2_1_;
      pR->nMyu = (char)stack0xffffffffffffffcb;
      pR->pVars[0] = (char)((uint7)stack0xffffffffffffffcb >> 8);
      pR->pVars[1] = (char)((uint7)stack0xffffffffffffffcb >> 0x10);
      pR->pVars[2] = (char)((uint7)stack0xffffffffffffffcb >> 0x18);
      pR->pVars[3] = (char)((uint7)stack0xffffffffffffffcb >> 0x20);
      pR->pVars[4] = (char)((uint7)stack0xffffffffffffffcb >> 0x28);
      pR->pVars[5] = (char)((uint7)stack0xffffffffffffffcb >> 0x30);
      pR->pVars[6] = R.nVars;
      pR->pVars[7] = R.nMyu;
      pR->pVars[8] = R.pVars[0];
      pR->pVars[9] = R.pVars[1];
      pR->pVars[10] = R.pVars[2];
      pR->pVars[0xb] = R.pVars[3];
      pR->pVars[0xc] = R.pVars[4];
      pR->pVars[0xd] = R.pVars[5];
      *(undefined2 *)(pR->pVars + 0xe) = R.pVars._6_2_;
      if (pFunc0 != (word *)0x0) {
        *pFunc0 = local_4048;
      }
      if (pFunc1 != (word *)0x0) {
        *pFunc1 = wVar3;
      }
    }
    if (Truth != 0) {
      uVar2 = If_CluGrp2Uns(__return_storage_ptr__);
      *(uint *)Truth = uVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

If_Grp_t If_CluCheck( If_Man_t * p, word * pTruth0, int nVars, int iVarStart, int iVarStop, int nLutLeaf, int nLutRoot, 
                     If_Grp_t * pR, word * pFunc0, word * pFunc1, word * pLeftOver, int fHashing )
{
//    int fEnableHashing = 0;
    If_Grp_t G1 = {0}, R = {0};
    unsigned * pHashed = NULL;
    word Truth, pTruth[CLU_WRD_MAX], pF[CLU_WRD_MAX];//, pG[CLU_WRD_MAX];
    int V2P[CLU_VAR_MAX+2], P2V[CLU_VAR_MAX+2], pCanonPerm[CLU_VAR_MAX];
    int i, nSupp, uCanonPhase;
    int nLutSize = p ? p->pPars->nLutSize : nVars;
    assert( nVars <= CLU_VAR_MAX );
    assert( nVars <= nLutLeaf + nLutRoot - 1 );

    if ( pR )
    {
        pR->nVars = 0;
        *pFunc0 = 0;
        *pFunc1 = 0;
    }

    // canonicize truth table
    If_CluCopy( pTruth, pTruth0, nLutSize );

    if ( 0 )
    {
        uCanonPhase = If_CluSemiCanonicize( pTruth, nVars, pCanonPerm );
        If_CluAdjustBig( pTruth, nVars, nLutSize );
    }

//    If_CluSemiCanonicizeVerify( pTruth, pTruth0, nVars, pCanonPerm, uCanonPhase );
//    If_CluCopy( pTruth, pTruth0, nLutSize );

 /*
    {
        int pCanonPerm[32];
        short pStore[32];
        unsigned uCanonPhase;
        If_CluCopy( pF, pTruth, nVars );
        uCanonPhase = Kit_TruthSemiCanonicize( pF, pG, nVars, pCanonPerm );
        G1.nVars = 1;
        return G1;
    }
*/
    // check minnimum base
    If_CluCopy( pF, pTruth, nVars );
    for ( i = 0; i < nVars; i++ )
        V2P[i] = P2V[i] = i;
    // check support
    nSupp = If_CluSupport( pF, nVars );
//Extra_PrintBinary( stdout, &nSupp, 16 );  printf( "\n" );
    if ( !nSupp || !If_CluSuppIsMinBase(nSupp) )
    {
//        assert( 0 );     
        return G1;
    }

    // check hash table
    if ( p && fHashing )
    {
        pHashed = If_CluHashLookup( p, pTruth, 0 );
        if ( pHashed && *pHashed != CLU_UNUSED )
            If_CluUns2Grp( *pHashed, &G1 );
    }

    // update the variable order so that the first var was the last one
    if ( iVarStop )
        If_CluMoveVar( pF, nVars, V2P, P2V, 0, nVars-1 );

    if ( G1.nVars == 0 ) 
    {
        s_Count2++;

        // detect easy cofs
        if ( iVarStart == 0 )
            G1 = If_CluDecUsingCofs( pTruth, nVars, nLutLeaf );
        if ( G1.nVars == 0 )
        {
            // perform testing
            G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
    //        If_CluCheckPerm( pTruth, pF, nVars, V2P, P2V );
            if ( G1.nVars == 0 )
            {
                // perform testing with a smaller set
                if ( nVars < nLutLeaf + nLutRoot - 2 )
                {
                    nLutLeaf--;
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
                    nLutLeaf++;
                }
                // perform testing with a smaller set
                if ( nLutLeaf > 4 && nVars < nLutLeaf + nLutRoot - 3 )
                {
                    nLutLeaf--;
                    nLutLeaf--;
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
                    nLutLeaf++;
                    nLutLeaf++;
                }
                if ( G1.nVars == 0 )
                {
                    // perform testing with a different order
                    If_CluReverseOrder( pF, nVars, V2P, P2V, iVarStart );
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );

                    // check permutation
    //                If_CluCheckPerm( pTruth, pF, nVars, V2P, P2V );
                    if ( G1.nVars == 0 )
                    {
                        // remember free set, just in case
//                        for ( i = 0; i < nVars - nLutLeaf; i++ )
///                           G1.pVars[nLutLeaf+i] = P2V[i];
                        // if <XY>, this will not be used
                        // if <XYZ>, this will not be hashed

    /*
                        if ( nVars == 6 )
                        {
                            Extra_PrintHex( stdout, (unsigned *)pF, nVars );  printf( "    " );
                            Kit_DsdPrintFromTruth( (unsigned*)pF, nVars );  printf( "\n" );
                            if ( !If_CutPerformCheck07( (unsigned *)pF, 6, 6, NULL ) )
                                printf( "no\n" );
                        } 
    */
                        if ( pHashed )
                            *pHashed = If_CluGrp2Uns( &G1 );
                        return G1;
                    }
                }
            }
        }
    }

    // derive
    if ( pR )
    {
        int iNewPos;

        If_CluMoveGroupToMsb( pF, nVars, V2P, P2V, &G1 );
        if ( G1.nMyu == 2 )
        {
            Truth = If_CluDeriveDisjoint( pF, nVars, V2P, P2V, &G1, &R );
            iNewPos = R.nVars - 1;
        }
        else
        {
            Truth = If_CluDeriveNonDisjoint( pF, nVars, V2P, P2V, &G1, &R );
            iNewPos = R.nVars - 2;
        }
        assert( R.pVars[iNewPos] == nVars );

        // adjust the functions
        Truth = If_CluAdjust( Truth, G1.nVars );
        if ( R.nVars < 6 )
            pF[0] = If_CluAdjust( pF[0], R.nVars );

//        Kit_DsdPrintFromTruth( (unsigned*)&Truth, G1.nVars ); printf( "  ...1\n" );
//        Kit_DsdPrintFromTruth( (unsigned*)pF, R.nVars );      printf( "  ...1\n" );

        // update the variable order of R so that the new var was the first one
//        if ( iVarStart == 0 )
        {
            int k, V2P2[CLU_VAR_MAX+2], P2V2[CLU_VAR_MAX+2];
            assert( iNewPos >= iVarStart );
            for ( k = 0; k < R.nVars; k++ )
                V2P2[k] = P2V2[k] = k;
            If_CluMoveVar( pF, R.nVars, V2P2, P2V2, iNewPos, iVarStart );
            for ( k = iNewPos; k > iVarStart; k-- )
                R.pVars[k] = R.pVars[k-1];
            R.pVars[iVarStart] = nVars;
        }

//        Kit_DsdPrintFromTruth( (unsigned*)pF, R.nVars ); printf( "  ...2\n" );

        if ( pLeftOver )
        {
            if ( R.nVars < 6 )
                *pLeftOver = If_CluAdjust( pF[0], R.nVars );
            else
                If_CluCopy( pLeftOver, pF, R.nVars );
            If_CluAdjustBig( pLeftOver, R.nVars, nLutSize );
        }

        // perform checking
        if ( 0 )
        {
            If_CluCheckGroup( pTruth, nVars, &G1 );
            If_CluVerify( pTruth, nVars, &G1, &R, Truth, pF );
        } 

        // save functions
        *pR = R;
        if ( pFunc0 )
            *pFunc0 = pF[0];
        if ( pFunc1 )
            *pFunc1 = Truth;
    }

    if ( pHashed )
        *pHashed = If_CluGrp2Uns( &G1 );
    return G1;
}